

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

int ws_listener_set_send_text(void *arg,void *buf,size_t sz,nni_type t)

{
  _Bool local_35;
  int local_34;
  _Bool b;
  void *pvStack_30;
  int rv;
  nni_ws_listener *l;
  size_t sStack_20;
  nni_type t_local;
  size_t sz_local;
  void *buf_local;
  void *arg_local;
  
  pvStack_30 = arg;
  l._4_4_ = t;
  sStack_20 = sz;
  sz_local = (size_t)buf;
  buf_local = arg;
  local_34 = nni_copyin_bool(&local_35,buf,sz,t);
  if (local_34 == 0) {
    nni_mtx_lock((nni_mtx *)((long)pvStack_30 + 0x60));
    *(byte *)((long)pvStack_30 + 0x113) = local_35 & 1;
    nni_mtx_unlock((nni_mtx *)((long)pvStack_30 + 0x60));
  }
  return local_34;
}

Assistant:

static int
ws_listener_set_send_text(void *arg, const void *buf, size_t sz, nni_type t)
{
	nni_ws_listener *l = arg;
	int              rv;
	bool             b;

	if ((rv = nni_copyin_bool(&b, buf, sz, t)) == 0) {
		nni_mtx_lock(&l->mtx);
		l->send_text = b;
		nni_mtx_unlock(&l->mtx);
	}
	return (rv);
}